

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O0

int ffwopen(FILE **ffp,char *fn,buffer *bp)

{
  int __fd;
  int *piVar1;
  char *pcVar2;
  FILE *pFVar3;
  uint local_30;
  mode_t fmode;
  int fd;
  buffer *bp_local;
  char *fn_local;
  FILE **ffp_local;
  
  local_30 = 0x1b6;
  if ((bp != (buffer *)0x0) && ((bp->b_fi).fi_mode != 0)) {
    local_30 = (bp->b_fi).fi_mode & 0xfff;
  }
  __fd = open(fn,0x242,(ulong)local_30);
  if (__fd == -1) {
    dobeep();
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    ewprintf("Cannot open file for writing : %s",pcVar2);
    ffp_local._4_4_ = 3;
  }
  else {
    pFVar3 = fdopen(__fd,"w");
    *ffp = (FILE *)pFVar3;
    if (pFVar3 == (FILE *)0x0) {
      dobeep();
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      ewprintf("Cannot open file for writing : %s",pcVar2);
      close(__fd);
      ffp_local._4_4_ = 3;
    }
    else {
      if ((bp != (buffer *)0x0) && ((bp->b_fi).fi_mode != 0)) {
        fchmod(__fd,(bp->b_fi).fi_mode & 0xfff);
        fchown(__fd,(bp->b_fi).fi_uid,(bp->b_fi).fi_gid);
      }
      ffp_local._4_4_ = 0;
    }
  }
  return ffp_local._4_4_;
}

Assistant:

int
ffwopen(FILE ** ffp, const char *fn, struct buffer *bp)
{
	int	fd;
	mode_t	fmode = DEFFILEMODE;

	if (bp && bp->b_fi.fi_mode)
		fmode = bp->b_fi.fi_mode & 07777;

	fd = open(fn, O_RDWR | O_CREAT | O_TRUNC, fmode);
	if (fd == -1) {
		ffp = NULL;
		dobeep();
		ewprintf("Cannot open file for writing : %s", strerror(errno));
		return (FIOERR);
	}

	if ((*ffp = fdopen(fd, "w")) == NULL) {
		dobeep();
		ewprintf("Cannot open file for writing : %s", strerror(errno));
		close(fd);
		return (FIOERR);
	}

	/*
	 * If we have file information, use it.  We don't bother to check for
	 * errors, because there's no a lot we can do about it.  Certainly
	 * trying to change ownership will fail if we aren't root.  That's
	 * probably OK.  If we don't have info, no need to get it, since any
	 * future writes will do the same thing.
	 */
	if (bp && bp->b_fi.fi_mode) {
		fchmod(fd, bp->b_fi.fi_mode & 07777);
		fchown(fd, bp->b_fi.fi_uid, bp->b_fi.fi_gid);
	}
	return (FIOSUC);
}